

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_lines(lua_State *L)

{
  int iVar1;
  char *fname;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_pushnil(L);
  }
  iVar1 = lua_type(L,1);
  if (iVar1 == 0) {
    lua_getfield(L,-0xf4628,"_IO_input");
    lua_copy(L,-1,1);
    lua_settop(L,-2);
    tofile(L);
  }
  else {
    fname = luaL_checklstring(L,1,(size_t *)0x0);
    opencheck(L,fname,"r");
    lua_copy(L,-1,1);
    lua_settop(L,-2);
  }
  aux_lines(L,(uint)(iVar1 != 0));
  return 1;
}

Assistant:

static int io_lines (lua_State *L) {
  int toclose;
  if (lua_isnone(L, 1)) lua_pushnil(L);  /* at least one argument */
  if (lua_isnil(L, 1)) {  /* no file name? */
    lua_getfield(L, LUA_REGISTRYINDEX, IO_INPUT);  /* get default input */
    lua_replace(L, 1);  /* put it at index 1 */
    tofile(L);  /* check that it's a valid file handle */
    toclose = 0;  /* do not close it after iteration */
  }
  else {  /* open a new file */
    const char *filename = luaL_checkstring(L, 1);
    opencheck(L, filename, "r");
    lua_replace(L, 1);  /* put file at index 1 */
    toclose = 1;  /* close it after iteration */
  }
  aux_lines(L, toclose);
  return 1;
}